

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void allocate_imp_vec<ImputedData<long,long_double>,InputData<float,long>>
               (vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                *impute_vec,InputData<float,_long> *input_data,int nthreads)

{
  long lVar1;
  size_t row;
  ulong row_00;
  
  std::vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
  resize(impute_vec,input_data->nrows);
  lVar1 = 0;
  for (row_00 = 0; row_00 < input_data->nrows; row_00 = row_00 + 1) {
    if ((input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[row_00] != '\0') {
      initialize_impute_calc<ImputedData<long,long_double>,InputData<float,long>>
                ((ImputedData<long,_long_double> *)
                 ((long)&(((impute_vec->
                           super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->num_sum).
                         super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl +
                 lVar1),input_data,row_00);
    }
    lVar1 = lVar1 + 0xf0;
  }
  return;
}

Assistant:

void allocate_imp_vec(std::vector<ImputedData> &impute_vec, InputData &input_data, int nthreads)
{
    impute_vec.resize(input_data.nrows);
    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) shared(impute_vec, input_data)
    for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
        if (input_data.has_missing[row])
            initialize_impute_calc(impute_vec[row], input_data, row);
}